

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnSimdLaneOp(TypeChecker *this,Opcode opcode,uint64_t lane_idx)

{
  uint32_t uVar1;
  Result RVar2;
  ulong uVar3;
  Opcode local_1c;
  
  local_1c.enum_ = opcode.enum_;
  uVar1 = Opcode::GetSimdLaneCount(&local_1c);
  uVar3 = (ulong)uVar1;
  if (uVar3 <= lane_idx) {
    PrintError(this,"lane index must be less than %d (got %lu)",uVar3,lane_idx);
  }
  if (local_1c.enum_ - I8X16ExtractLaneS < 0xe) {
    if ((0x155bU >> (local_1c.enum_ - I8X16ExtractLaneS & 0x1f) & 1) == 0) {
      RVar2 = CheckOpcode2(this,local_1c,(Limits *)0x0);
    }
    else {
      RVar2 = CheckOpcode1(this,local_1c,(Limits *)0x0);
    }
    RVar2.enum_._0_1_ = RVar2.enum_ == Error || uVar3 <= lane_idx;
    RVar2.enum_._1_3_ = 0;
    return (Result)RVar2.enum_;
  }
  abort();
}

Assistant:

Result TypeChecker::OnSimdLaneOp(Opcode opcode, uint64_t lane_idx) {
  Result result = Result::Ok;
  uint32_t lane_count = opcode.GetSimdLaneCount();
  if (lane_idx >= lane_count) {
    PrintError("lane index must be less than %d (got %" PRIu64 ")", lane_count,
               lane_idx);
    result = Result::Error;
  }

  switch (opcode) {
    case Opcode::I8X16ExtractLaneS:
    case Opcode::I8X16ExtractLaneU:
    case Opcode::I16X8ExtractLaneS:
    case Opcode::I16X8ExtractLaneU:
    case Opcode::I32X4ExtractLane:
    case Opcode::F32X4ExtractLane:
    case Opcode::I64X2ExtractLane:
    case Opcode::F64X2ExtractLane:
      result |= CheckOpcode1(opcode);
      break;
    case Opcode::I8X16ReplaceLane:
    case Opcode::I16X8ReplaceLane:
    case Opcode::I32X4ReplaceLane:
    case Opcode::F32X4ReplaceLane:
    case Opcode::I64X2ReplaceLane:
    case Opcode::F64X2ReplaceLane:
      result |= CheckOpcode2(opcode);
      break;
    default:
      WABT_UNREACHABLE;
  }
  return result;
}